

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int32_t ecs_reader_read(char *buffer,int32_t size,ecs_reader_t *reader)

{
  ecs_size_t eVar1;
  ecs_size_t local_34;
  int local_30;
  int32_t remaining;
  int32_t total_read;
  int32_t read;
  ecs_reader_t *reader_local;
  int32_t size_local;
  char *buffer_local;
  
  local_30 = 0;
  if (size == 0) {
    buffer_local._4_4_ = 0;
  }
  else {
    _ecs_assert(3 < size,2,(char *)0x0,"size >= ECS_SIZEOF(int32_t)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                ,0x14f);
    if (size < 4) {
      __assert_fail("size >= (ecs_size_t)sizeof(int32_t)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x14f,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
    }
    _ecs_assert(size % 4 == 0,2,(char *)0x0,"size % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                ,0x150);
    if (size % 4 != 0) {
      __assert_fail("size % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x150,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
    }
    local_34 = size;
    if (reader->state == EcsTableSegment) {
      while (eVar1 = ecs_table_reader(buffer + local_30,local_34,reader), eVar1 != 0) {
        local_34 = local_34 - eVar1;
        local_30 = eVar1 + local_30;
        if (reader->state != EcsTableSegment) break;
        _ecs_assert(local_34 % 4 == 0,0xc,(char *)0x0,"remaining % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x15b);
        if (local_34 % 4 != 0) {
          __assert_fail("remaining % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                        ,0x15b,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
        }
      }
    }
    buffer_local._4_4_ = local_30;
  }
  return buffer_local._4_4_;
}

Assistant:

int32_t ecs_reader_read(
    char *buffer,
    int32_t size,
    ecs_reader_t *reader)
{
    int32_t read, total_read = 0, remaining = size;

    if (!size) {
        return 0;
    }

    ecs_assert(size >= ECS_SIZEOF(int32_t), ECS_INVALID_PARAMETER, NULL);
    ecs_assert(size % 4 == 0, ECS_INVALID_PARAMETER, NULL);

    if (reader->state == EcsTableSegment) {
        while ((read = ecs_table_reader(ECS_OFFSET(buffer, total_read), remaining, reader))) {
            remaining -= read;
            total_read += read;

            if (reader->state != EcsTableSegment) {
                break;
            }

            ecs_assert(remaining % 4 == 0, ECS_INTERNAL_ERROR, NULL);        
        }
    }  
    
    return total_read;
}